

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall glslang::TQualifier::clear(TQualifier *this)

{
  this->field_0xb = this->field_0xb & 0xe1;
  makeTemporary(this);
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xe3ffffe7fe00ffff;
  return;
}

Assistant:

void clear()
    {
        precision = EpqNone;
        invariant = false;
        makeTemporary();
        declaredBuiltIn = EbvNone;
        noContraction = false;
        nullInit = false;
        spirvByReference = false;
        spirvLiteral = false;
        defaultBlock = false;
    }